

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall
cppforth::Forth::setSourceVariables(Forth *this,Cell Source,Cell sourceSize,Cell sourceMoreIn)

{
  CAddr CVar1;
  Cell i_1;
  Cell i;
  int iVar2;
  
  CVar1 = this->VarOffsetSourceAddress;
  iVar2 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar2,(Char)Source);
    Source = Source >> 8;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  CVar1 = this->VarOffsetSourceSize;
  iVar2 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar2,(Char)sourceSize);
    sourceSize = sourceSize >> 8;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  CVar1 = this->VarOffsetSourceOffset;
  iVar2 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar2,(Char)sourceMoreIn);
    sourceMoreIn = sourceMoreIn >> 8;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  return;
}

Assistant:

void setSourceVariables(Cell Source, Cell sourceSize, Cell sourceMoreIn) {
			setSourceAddress(Source);
			setSourceBufferSize(sourceSize);
			setSourceBufferOffset(sourceMoreIn);
		}